

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O1

int nni_posix_pollq_sysinit(nng_init_params *params)

{
  nni_mtx *mtx;
  ushort uVar1;
  nni_posix_pollq *pnVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ushort uVar7;
  nni_thr *thr;
  long lVar8;
  epoll_event local_40;
  
  uVar3 = params->max_poller_threads;
  uVar1 = params->num_poller_threads;
  uVar7 = uVar3;
  if ((short)uVar1 < (short)uVar3) {
    uVar7 = uVar1;
  }
  if ((short)uVar3 < 1) {
    uVar7 = uVar1;
  }
  uVar3 = 1;
  if (1 < (short)uVar7) {
    uVar3 = uVar7;
  }
  params->num_poller_threads = uVar3;
  nni_epoll_pqs = (nni_posix_pollq *)nni_zalloc((ulong)uVar3 * 0x120);
  if (nni_epoll_pqs == (nni_posix_pollq *)0x0) {
    iVar4 = 2;
  }
  else {
    lVar8 = 0;
    nni_epoll_npq = (uint)uVar3;
    do {
      pnVar2 = nni_epoll_pqs;
      mtx = (nni_mtx *)((long)&(nni_epoll_pqs->mtx).mtx + lVar8);
      nni_list_init_offset((nni_list *)((long)&(nni_epoll_pqs->reapq).ll_head.ln_next + lVar8),0);
      nni_mtx_init(mtx);
      nni_cv_init((nni_cv *)((long)&(pnVar2->cv).cv + lVar8),mtx);
      *(undefined4 *)((long)&pnVar2->epfd + lVar8) = 0xffffffff;
      (&pnVar2->init)[lVar8] = true;
      iVar4 = epoll_create1(0x80000);
      *(int *)((long)&pnVar2->epfd + lVar8) = iVar4;
      if (iVar4 < 0) {
        piVar6 = __errno_location();
        iVar4 = nni_plat_errno(*piVar6);
      }
      else {
        (&pnVar2->close)[lVar8] = false;
        local_40.data.fd = 0;
        local_40.events = 0;
        local_40._4_4_ = 0;
        iVar4 = eventfd(0,0x800);
        if (iVar4 < 0) {
LAB_0011aba2:
          piVar6 = __errno_location();
          iVar4 = nni_plat_errno(*piVar6);
        }
        else {
          fcntl(iVar4,2,1);
          fcntl(iVar4,4,0x800);
          local_40.events = 1;
          local_40._4_4_ = 0;
          local_40.data.fd = 0;
          iVar5 = epoll_ctl(*(int *)((long)&pnVar2->epfd + lVar8),1,iVar4,&local_40);
          if (iVar5 != 0) {
            close(iVar4);
            goto LAB_0011aba2;
          }
          *(int *)((long)&pnVar2->evfd + lVar8) = iVar4;
          iVar4 = 0;
        }
        if (iVar4 == 0) {
          thr = (nni_thr *)((long)&(pnVar2->thr).thr.tid + lVar8);
          iVar4 = nni_thr_init(thr,nni_epoll_thr,mtx);
          if (iVar4 == 0) {
            nni_thr_set_name(thr,"nng:poll:epoll");
            nni_thr_run(thr);
            iVar4 = 0;
            goto LAB_0011ac15;
          }
          close(*(int *)((long)&pnVar2->epfd + lVar8));
          iVar5 = *(int *)((long)&pnVar2->evfd + lVar8);
        }
        else {
          iVar5 = *(int *)((long)&pnVar2->epfd + lVar8);
        }
        close(iVar5);
        nni_mtx_fini(mtx);
      }
LAB_0011ac15:
      if (iVar4 != 0) {
        nni_posix_pollq_sysfini();
        return iVar4;
      }
      lVar8 = lVar8 + 0x120;
    } while ((ulong)uVar3 * 0x120 != lVar8);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
nni_posix_pollq_sysinit(nng_init_params *params)
{
	int16_t num_thr;
	int16_t max_thr;

	max_thr = params->max_poller_threads;
	num_thr = params->num_poller_threads;

	if ((max_thr > 0) && (num_thr > max_thr)) {
		num_thr = max_thr;
	}
	if (num_thr < 1) {
		num_thr = 1;
	}
	params->num_poller_threads = num_thr;
	if ((nni_epoll_pqs = NNI_ALLOC_STRUCTS(nni_epoll_pqs, num_thr)) ==
	    NULL) {
		return (NNG_ENOMEM);
	}

	nni_epoll_npq = num_thr;
	for (int i = 0; i < num_thr; i++) {
		int rv;
		if ((rv = nni_epoll_pq_create(&nni_epoll_pqs[i])) != 0) {
			nni_posix_pollq_sysfini();
			return (rv);
		}
	}
	return (0);
}